

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrometracer.cpp
# Opt level: O2

void __thiscall
CChromeTracer::writeDeviceTiming
          (CChromeTracer *this,char *name,uint64_t queuedTime,uint64_t submitTime,uint64_t startTime
          ,uint64_t endTime,uint64_t id)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 local_68 [16];
  double local_58;
  undefined1 local_48 [16];
  double local_38;
  
  auVar4._0_8_ = ((double)(queuedTime >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                 (double)(queuedTime & 0xffffffff | 0x4330000000000000);
  auVar4._8_8_ = ((double)(submitTime >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                 (double)(submitTime & 0xffffffff | 0x4330000000000000);
  local_48 = divpd(auVar4,_DAT_00187080);
  auVar5._8_4_ = (int)(startTime >> 0x20);
  auVar5._0_8_ = startTime;
  auVar5._12_4_ = 0x45300000;
  local_38 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)startTime) - 4503599627370496.0)) / 1000.0;
  auVar2._0_8_ = ((double)(submitTime - queuedTime >> 0x20 | 0x4530000000000000) -
                 1.9342813118337666e+25) +
                 (double)(submitTime - queuedTime & 0xffffffff | 0x4330000000000000);
  auVar2._8_8_ = ((double)(startTime - submitTime >> 0x20 | 0x4530000000000000) -
                 1.9342813118337666e+25) +
                 (double)(startTime - submitTime & 0xffffffff | 0x4330000000000000);
  local_68 = divpd(auVar2,_DAT_00187080);
  lVar1 = endTime - startTime;
  auVar3._8_4_ = (int)((ulong)lVar1 >> 0x20);
  auVar3._0_8_ = lVar1;
  auVar3._12_4_ = 0x45300000;
  local_58 = ((auVar3._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) / 1000.0;
  for (lVar1 = 0; lVar1 != 0x18; lVar1 = lVar1 + 8) {
    snprintf(this->m_StringBuffer,0x4000,
             "{\"ph\":\"X\",\"pid\":%lu,\"tid\":\"%s\",\"name\":\"%s %s\",\"ts\":%.3f,\"dur\":%.3f,\"cname\":\"%s\",\"args\":{\"id\":%lu}},\n"
             ,*(undefined8 *)(local_48 + lVar1),*(undefined8 *)(local_68 + lVar1),this->m_ProcessId,
             name,name,*(undefined8 *)((long)suffixes + lVar1),
             *(undefined8 *)((long)colours + lVar1),id);
    std::ostream::write((char *)&this->m_TraceFile,(long)this->m_StringBuffer);
  }
  return;
}

Assistant:

void CChromeTracer::writeDeviceTiming(
    const char* name,
    uint64_t queuedTime,
    uint64_t submitTime,
    uint64_t startTime,
    uint64_t endTime,
    uint64_t id )
{
    const double    usStarts[cNumStates] = {
        queuedTime / 1000.0,
        submitTime / 1000.0,
        startTime / 1000.0,
    };
    const double    usDeltas[cNumStates] = {
        (submitTime - queuedTime) / 1000.0,
        (startTime - submitTime) / 1000.0,
        (endTime - startTime) / 1000.0,
    };

    for( size_t state = 0; state < cNumStates; state++ )
    {
        int size = CLI_SPRINTF(m_StringBuffer, CLI_STRING_BUFFER_SIZE,
            "{\"ph\":\"X\",\"pid\":%" PRIu64 ",\"tid\":\"%s\",\"name\":\"%s %s\""
            ",\"ts\":%.3f,\"dur\":%.3f,\"cname\":\"%s\",\"args\":{\"id\":%" PRIu64 "}},\n",
            m_ProcessId,
            name,
            name,
            suffixes[state],
            usStarts[state],
            usDeltas[state],
            colours[state],
            id );
        m_TraceFile.write(m_StringBuffer, size);
    }
}